

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O1

void __thiscall CodeGen::CodeGen(CodeGen *this)

{
  ostringstream *this_00;
  ostringstream local_198 [8];
  stringbuf local_190 [104];
  ios_base local_128 [264];
  
  *(undefined ***)this = &PTR_visit_0010dcd8;
  this_00 = &this->builder;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ios::swap((ios *)(this_00 + *(long *)(*(long *)&this->builder + -0x18)));
  std::__cxx11::stringbuf::operator=((stringbuf *)&this->field_0x10,local_190);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  this->indentLevel = 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n"
             ,0x73);
  return;
}

Assistant:

explicit inline CodeGen() {
        builder = {};
        indentLevel = 1;

        builder << "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n";
        builder << "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n";
    }